

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2pbf.cpp
# Opt level: O2

void pbrt::semantic::usage(string *msg)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = std::operator!=(msg,"");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar2 = std::operator<<(poVar2,(string *)msg);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"./pbrt2pbf inFile.pbrt|inFile.pbf <args>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"  -o <out.pbf>   : where to write the output to");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "                   (tris to quads, removing reundant fields, etc)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar1 = std::operator==(msg,"");
  exit((uint)!bVar1);
}

Assistant:

void usage(const std::string &msg)
    {
      if (msg != "") std::cerr << "Error: " << msg << std::endl << std::endl;
      std::cout << "./pbrt2pbf inFile.pbrt|inFile.pbf <args>" << std::endl;
      std::cout << std::endl;
      std::cout << "  -o <out.pbf>   : where to write the output to" << std::endl;
      std::cout << "                   (tris to quads, removing reundant fields, etc)" << std::endl;
      std::cout << std::endl;
      exit(msg == "" ? 0 : 1);
    }